

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_genparams.hpp
# Opt level: O3

iuIParamGenerator<int> * __thiscall
iutest::detail::iuValueArray::operator_cast_to_iuIParamGenerator_(iuValueArray *this)

{
  placeholder *in_RAX;
  iuValuesInParamsGenerator<iutest::any> *this_00;
  make_array<iutest::any> ar;
  any local_18;
  
  local_18.content = in_RAX;
  iuValueArray<int>::make_array<iutest::any>::make_array
            ((make_array<iutest::any> *)&local_18,(_MyTuple *)this);
  this_00 = (iuValuesInParamsGenerator<iutest::any> *)operator_new(0x28);
  iuValuesInParamsGenerator<iutest::any>::iuValuesInParamsGenerator<iutest::any,1ul>
            (this_00,(any (*) [1])&local_18);
  if (local_18.content != (placeholder *)0x0) {
    (*(local_18.content)->_vptr_placeholder[1])();
  }
  return &this_00->super_iuIParamGenerator<int>;
}

Assistant:

operator iuIParamGenerator<T>* () const
    {
        make_array<T> ar(v);
#if !defined(IUTEST_NO_FUNCTION_TEMPLATE_ORDERING)
        return new iuValuesInParamsGenerator<T>(ar.val);
#else
        return new iuValuesInParamsGenerator<T>(ar.val, ar.val + IUTEST_PP_COUNTOF(ar.val));
#endif
    }